

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::Thermo::getAngularMomentum(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  double dVar1;
  uint i_1;
  Molecule *this_01;
  long lVar2;
  double dVar3;
  double dVar4;
  Vector<double,_3U> result;
  MoleculeIterator i;
  double local_118 [4];
  Vector3d local_f8;
  Vector3d *local_e0;
  RealType local_d8;
  MoleculeIterator local_d0;
  Vector3d local_c8;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasCOMw == false) {
    local_68.super_Vector<double,_3U>.data_[0] = 0.0;
    local_68.super_Vector<double,_3U>.data_[1] = 0.0;
    local_68.super_Vector<double,_3U>.data_[2] = 0.0;
    local_88.super_Vector<double,_3U>.data_[2] = 0.0;
    local_88.super_Vector<double,_3U>.data_[0] = 0.0;
    local_88.super_Vector<double,_3U>.data_[1] = 0.0;
    local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_e0 = __return_storage_ptr__;
    getComAll(this,&local_68,&local_88);
    local_d0._M_node = (_Base_ptr)0x0;
    this_01 = SimInfo::beginMolecule(this->info_,&local_d0);
    if (this_01 != (Molecule *)0x0) {
      do {
        local_d8 = Molecule::getMass(this_01);
        Molecule::getCom(&local_f8,this_01);
        local_118[0] = 0.0;
        local_118[1] = 0.0;
        local_118[2] = 0.0;
        lVar2 = 0;
        do {
          local_118[lVar2] =
               local_f8.super_Vector<double,_3U>.data_[lVar2] -
               local_68.super_Vector<double,_3U>.data_[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        local_98 = local_118[0];
        uStack_90 = 0;
        local_a8 = local_118[1];
        dStack_a0 = local_118[2];
        Molecule::getComVel(&local_48,this_01);
        local_f8.super_Vector<double,_3U>.data_[0] = 0.0;
        local_f8.super_Vector<double,_3U>.data_[1] = 0.0;
        local_f8.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar2 = 0;
        do {
          local_f8.super_Vector<double,_3U>.data_[lVar2] =
               local_48.super_Vector<double,_3U>.data_[lVar2] -
               local_88.super_Vector<double,_3U>.data_[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        local_118[0] = 0.0;
        local_118[1] = 0.0;
        local_118[2] = 0.0;
        lVar2 = 0;
        do {
          local_118[lVar2] = local_f8.super_Vector<double,_3U>.data_[lVar2] * local_d8;
          dVar1 = local_118[0];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        dVar4 = local_98 * local_118[1];
        dVar3 = local_118[0] * dStack_a0;
        local_118[0] = local_118[2] * local_a8 - dStack_a0 * local_118[1];
        local_118[1] = dVar3 - local_98 * local_118[2];
        local_118[2] = dVar4 - dVar1 * local_a8;
        lVar2 = 0;
        do {
          local_c8.super_Vector<double,_3U>.data_[lVar2] =
               local_118[lVar2] + local_c8.super_Vector<double,_3U>.data_[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        this_01 = SimInfo::nextMolecule(this->info_,&local_d0);
      } while (this_01 != (Molecule *)0x0);
    }
    Snapshot::setCOMw(this_00,&local_c8);
    __return_storage_ptr__ = local_e0;
  }
  Snapshot::getCOMw(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getAngularMomentum() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOMw) {
      Vector3d com(0.0);
      Vector3d comVel(0.0);
      Vector3d angularMomentum(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d thisr(0.0);
      Vector3d thisp(0.0);

      RealType thisMass;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        thisMass = mol->getMass();
        thisr    = mol->getCom() - com;
        thisp    = (mol->getComVel() - comVel) * thisMass;

        angularMomentum += cross(thisr, thisp);
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
    }

    return snap->getCOMw();
  }